

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::BinaryReadError::BinaryReadError
          (BinaryReadError *this,string *filename,size_t offset,CStringRef message)

{
  pointer pcVar1;
  
  Error::Error(&this->super_Error,message,-1);
  *(undefined ***)&(this->super_Error).super_RuntimeError = &PTR__BinaryReadError_0019ad18;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename_,pcVar1,pcVar1 + filename->_M_string_length);
  this->offset_ = offset;
  return;
}

Assistant:

BinaryReadError(
      const std::string &filename, std::size_t offset, fmt::CStringRef message)
  : Error(message), filename_(filename), offset_(offset) {}